

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O3

void winit_io(void)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 0;
  printf("Init write IO system...");
  crt_regs[0] = '\0';
  crt_regs[1] = '\0';
  crt_regs[2] = '\0';
  crt_regs[3] = '\0';
  crt_regs[4] = '\0';
  crt_regs[5] = '\0';
  crt_regs[6] = '\0';
  crt_regs[7] = '\0';
  crt_regs[8] = '\0';
  crt_regs[9] = '\0';
  crt_regs[10] = '\0';
  crt_regs[0xb] = '\0';
  crt_regs[0xc] = '\0';
  crt_regs[0xd] = '\0';
  crt_regs[0xe] = '\0';
  crt_regs[0xf] = '\0';
  crt_regs[0x10] = '\0';
  crt_regs[0x11] = '\0';
  s_via[0] = '\0';
  s_via[1] = '\0';
  s_via[2] = '\0';
  s_via[3] = '\0';
  s_via[4] = '\0';
  s_via[5] = '\0';
  s_via[6] = '\0';
  s_via[7] = '\0';
  s_via[8] = '\0';
  s_via[9] = '\0';
  s_via[10] = '\0';
  s_via[0xb] = '\0';
  s_via[0xc] = '\0';
  s_via[0xd] = '\0';
  s_via[0xe] = '\0';
  s_via[0xf] = '\0';
  s_via_latch[0] = '\0';
  s_via_latch[1] = '\0';
  s_via_latch[2] = '\0';
  s_via_latch[3] = '\0';
  s_via_latch[4] = '\0';
  s_via_latch[5] = '\0';
  s_via_latch[6] = '\0';
  s_via_latch[7] = '\0';
  do {
    *(undefined4 *)((long)wsheila + lVar2) = 0x10a478;
    *(undefined4 *)((long)wsheila + lVar2 + 4) = 0;
    *(undefined4 *)((long)wsheila + lVar2 + 8) = 0x10a478;
    *(undefined4 *)((long)wsheila + lVar2 + 0xc) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x800);
  uVar1 = 0xfffffffffffffffe;
  do {
    wsheila[uVar1 + 2] = crt_select;
    wsheila[uVar1 + 3] = write_crt;
    uVar1 = uVar1 + 2;
  } while (uVar1 < 6);
  uVar1 = 0x1e;
  do {
    wsheila[uVar1 + 2] = vid_ULA;
    wsheila[uVar1 + 3] = vidpalset;
    uVar1 = uVar1 + 2;
  } while (uVar1 < 0x2e);
  lVar2 = 0;
  do {
    *(undefined4 *)(wsheila + lVar2 + 0x30) = 0x10a625;
    *(undefined4 *)((long)wsheila + lVar2 * 8 + 0x184) = 0;
    *(undefined4 *)(wsheila + lVar2 + 0x31) = 0x10a625;
    *(undefined4 *)((long)wsheila + lVar2 * 8 + 0x18c) = 0;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x10);
  wsheila[0x40] = sw_via_0;
  wsheila[0x50] = sw_via_0;
  wsheila[0x41] = sw_via_1;
  wsheila[0x51] = sw_via_1;
  wsheila[0x42] = sw_via_2;
  wsheila[0x52] = sw_via_2;
  wsheila[0x43] = sw_via_3;
  wsheila[0x53] = sw_via_3;
  wsheila[0x44] = sw_via_4;
  wsheila[0x54] = sw_via_4;
  wsheila[0x45] = sw_via_5;
  wsheila[0x55] = sw_via_5;
  wsheila[0x46] = sw_via_6;
  wsheila[0x56] = sw_via_6;
  wsheila[0x47] = sw_via_7;
  wsheila[0x57] = sw_via_7;
  wsheila[0x48] = sw_via_8;
  wsheila[0x58] = sw_via_8;
  wsheila[0x49] = sw_via_9;
  wsheila[0x59] = sw_via_9;
  wsheila[0x4a] = sw_via_A;
  wsheila[0x5a] = sw_via_A;
  wsheila[0x4b] = sw_via_B;
  wsheila[0x5b] = sw_via_B;
  wsheila[0x4c] = sw_via_C;
  wsheila[0x5c] = sw_via_C;
  wsheila[0x4d] = sw_via_D;
  wsheila[0x5d] = sw_via_D;
  wsheila[0x4e] = sw_via_E;
  wsheila[0x5e] = sw_via_E;
  wsheila[0x4f] = sw_via_F;
  wsheila[0x5f] = sw_via_F;
  uVar1 = 0xbc;
  do {
    wsheila[uVar1 + 4] = adc_con_reg;
    uVar1 = uVar1 + 4;
  } while (uVar1 < 0xdc);
  puts("Done");
  return;
}

Assistant:

void winit_io(void)              // Called to do any io_write initialising
{
    unsigned int c; // misc loop counter

    printf("Init write IO system...");  // Display pretty startup info

    for (c = 0; c <= 17; c++) crt_regs[c] = 0;   // initialise the arrays to 0
    for (c = 0; c <= 15; c++) s_via[c] = 0;
    for (c = 0; c <= 7; c++) s_via_latch[c] = 0;

    for (c = 0x00; c <= 0xFF; c++)          // initialise wsheila to point to a
    {                                 // dummy function
        wsheila[c] = nullwrite;
    }

    for (c = 0x00; c <= 0x07; c += 2) {
        wsheila[c] = crt_select;
        wsheila[c + 1] = write_crt;
    }

    for (c = 0x20; c <= 0x2F; c += 0x02) {
        wsheila[c] = vid_ULA;
        wsheila[c + 1] = vidpalset;
    }

    for (c = 0x30; c <= 0x3F; c++) {
        wsheila[c] = promsel;
    }

    wsheila[0x50] = wsheila[0x40] = sw_via_0;
    wsheila[0x51] = wsheila[0x41] = sw_via_1;
    wsheila[0x52] = wsheila[0x42] = sw_via_2;
    wsheila[0x53] = wsheila[0x43] = sw_via_3;
    wsheila[0x54] = wsheila[0x44] = sw_via_4;
    wsheila[0x55] = wsheila[0x45] = sw_via_5;
    wsheila[0x56] = wsheila[0x46] = sw_via_6;
    wsheila[0x57] = wsheila[0x47] = sw_via_7;
    wsheila[0x58] = wsheila[0x48] = sw_via_8;
    wsheila[0x59] = wsheila[0x49] = sw_via_9;
    wsheila[0x5A] = wsheila[0x4A] = sw_via_A;
    wsheila[0x5B] = wsheila[0x4B] = sw_via_B;
    wsheila[0x5C] = wsheila[0x4C] = sw_via_C;
    wsheila[0x5D] = wsheila[0x4D] = sw_via_D;
    wsheila[0x5E] = wsheila[0x4E] = sw_via_E;
    wsheila[0x5F] = wsheila[0x4F] = sw_via_F;

    for (c = 0xC0; c <= 0xDF; c += 0x04) {
        wsheila[c] = adc_con_reg;
    }

    printf("Done\n");   // display pretty startup status
}